

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS ref_recon_mask_edg(REF_GRID ref_grid,REF_BOOL *replace,REF_INT ldim)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  int local_3c;
  int local_38;
  int local_34;
  REF_INT node;
  REF_INT i;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT ldim_local;
  REF_BOOL *replace_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  pRVar2 = ref_grid->cell[0];
  for (local_38 = 0; local_38 < pRVar1->max; local_38 = local_38 + 1) {
    if (((-1 < local_38) && (local_38 < pRVar1->max)) && (-1 < pRVar1->global[local_38])) {
      for (local_34 = 0; local_34 < ldim; local_34 = local_34 + 1) {
        if ((local_38 < 0) || (pRVar2->ref_adj->nnode <= local_38)) {
          local_3c = -1;
        }
        else {
          local_3c = pRVar2->ref_adj->first[local_38];
        }
        replace[local_34 + ldim * local_38] = (uint)(local_3c != -1);
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_mask_edg(REF_GRID ref_grid,
                                             REF_BOOL *replace, REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_INT i, node;

  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < ldim; i++) {
      replace[i + ldim * node] = !ref_cell_node_empty(ref_cell, node);
    }
  }
  return REF_SUCCESS;
}